

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O0

void __thiscall
xray_re::xr_level_ai::vertex_position
          (xr_level_ai *this,uint32_t *packed_xz,uint16_t *packed_y,fvector3 *position)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  float z;
  float x;
  fvector3 *position_local;
  uint16_t *packed_y_local;
  uint32_t *packed_xz_local;
  xr_level_ai *this_local;
  
  fVar1 = (position->field_0).field_0.z;
  fVar2 = this->m_size;
  fVar3 = (this->m_aabb).field_0.field_1.z1;
  dVar5 = std::floor((double)(ulong)(uint)(((position->field_0).field_0.x -
                                           (this->m_aabb).field_0.field_1.x1) / this->m_size + 0.5))
  ;
  uVar4 = this->m_row_length;
  dVar6 = std::floor((double)(ulong)(uint)((fVar1 - fVar3) / fVar2 + 0.5));
  *packed_xz = (int)(long)SUB84(dVar5,0) * uVar4 + (int)(long)SUB84(dVar6,0);
  dVar5 = std::floor((double)(ulong)(uint)((((position->field_0).field_0.y -
                                            (this->m_aabb).field_0.field_1.y1) / this->m_size_y) *
                                           65535.0 + 1e-07));
  *packed_y = (uint16_t)(int)SUB84(dVar5,0);
  return;
}

Assistant:

void xr_level_ai::vertex_position(uint32_t& packed_xz, uint16_t& packed_y, const fvector3& position) const
{
	float x = (position.x - m_aabb.min.x)/m_size + 0.5f;
	float z = (position.z - m_aabb.min.z)/m_size + 0.5f;
	packed_xz = uint32_t(std::floor(x))*m_row_length + uint32_t(std::floor(z));
	packed_y = uint16_t(std::floor((position.y - m_aabb.min.y)/m_size_y*65535.f + 1e-7f));
}